

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O2

void p_bre(parse *p,int end1,int end2)

{
  int *piVar1;
  size_t opnd;
  char *pcVar2;
  long lVar3;
  re_guts *prVar4;
  byte *pbVar5;
  byte *pbVar6;
  long lVar7;
  size_t sVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  ushort **ppuVar12;
  char *pcVar13;
  long lVar14;
  bool bVar15;
  char *pcVar16;
  uint uVar17;
  ulong opnd_00;
  
  pcVar16 = p->next;
  lVar3 = p->slen;
  if ((pcVar16 < p->end) && (*pcVar16 == '^')) {
    p->next = pcVar16 + 1;
    doemit(p,0xc000000,0);
    prVar4 = p->g;
    piVar1 = &prVar4->iflags;
    *piVar1 = *piVar1 | 1;
    piVar1 = &prVar4->nbol;
    *piVar1 = *piVar1 + 1;
  }
  bVar15 = true;
  bVar9 = false;
LAB_00104030:
  pbVar5 = (byte *)p->next;
  pbVar6 = (byte *)p->end;
  if ((pbVar6 <= pbVar5) ||
     (((pcVar16 = (char *)(pbVar5 + 1), pcVar16 < pbVar6 && ((char)*pbVar5 == end1)) &&
      (*pcVar16 == end2)))) {
    lVar14 = p->slen;
    if (!bVar15) {
      p->slen = lVar14 + -1;
      doemit(p,0x10000000,0);
      prVar4 = p->g;
      piVar1 = &prVar4->iflags;
      *piVar1 = *piVar1 | 2;
      piVar1 = &prVar4->neol;
      *piVar1 = *piVar1 + 1;
      lVar14 = p->slen;
    }
    if (lVar14 == lVar3) {
      if (p->error == 0) {
        p->error = 0xe;
      }
      p->next = nuls;
      p->end = nuls;
    }
    return;
  }
  lVar14 = p->slen;
  p->next = pcVar16;
  uVar17 = (uint)(char)*pbVar5;
  if (uVar17 == 0x5c) {
    if (pbVar6 <= pcVar16) {
      if (p->error == 0) {
        p->error = 5;
      }
      p->end = nuls;
      pcVar16 = nuls;
    }
    p->next = (char *)((byte *)pcVar16 + 1);
    uVar17 = (byte)*pcVar16 | 0x100;
  }
  if (uVar17 - 0x131 < 9) {
    if (0x39 < (uVar17 & 0xfffffeff)) {
      __assert_fail("i < NPAREN",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                    ,0x20b,"int p_simp_re()");
    }
    opnd_00 = (ulong)((uVar17 & 0xfffffeff) - 0x30);
    if (p->pend[opnd_00] == 0) {
      if (p->error == 0) {
        p->error = 6;
      }
      p->next = nuls;
      p->end = nuls;
    }
    else {
      if (p->g->nsub < opnd_00) {
        __assert_fail("(size_t) i <= p->g->nsub",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                      ,0x20d,"int p_simp_re()");
      }
      doemit(p,0x1c000000,opnd_00);
      lVar7 = p->pbegin[opnd_00];
      if (lVar7 == 0) {
        __assert_fail("p->pbegin[i] != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                      ,0x20f,"int p_simp_re()");
      }
      if ((*(uint *)(p->strip + lVar7) & 0x7c000000) != 0x34000000) {
        __assert_fail("OP(p->strip[p->pbegin[i]]) == OLPAREN",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                      ,0x210,"int p_simp_re()");
      }
      if ((*(uint *)(p->strip + p->pend[opnd_00]) & 0x7c000000) != 0x38000000) {
        __assert_fail("OP(p->strip[p->pend[i]]) == ORPAREN",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                      ,0x211,"int p_simp_re()");
      }
      dupl(p,lVar7 + 1,p->pend[opnd_00]);
      doemit(p,0x20000000,opnd_00);
    }
    p->g->backrefs = 1;
  }
  else if (uVar17 == 0x2a) {
    if (bVar9) {
      if (p->error == 0) {
        p->error = 0xd;
      }
      p->next = nuls;
      p->end = nuls;
    }
LAB_001042d3:
    ordinary(p,(int)(char)uVar17);
  }
  else if (uVar17 == 0x17d) {
LAB_001041dc:
    iVar11 = p->error;
joined_r0x001041e0:
    if (iVar11 == 0) {
      p->error = 8;
    }
LAB_001042f3:
    p->next = nuls;
    p->end = nuls;
  }
  else if (uVar17 == 0x5b) {
    p_bracket(p);
  }
  else {
    if (uVar17 != 0x128) {
      if (uVar17 == 0x129) goto LAB_001041dc;
      if (uVar17 != 0x17b) {
        if (uVar17 != 0x2e) goto LAB_001042d3;
        if ((p->g->cflags & 8) == 0) {
          doemit(p,0x14000000,0);
        }
        else {
          nonnewline(p);
        }
        goto LAB_001042fa;
      }
      if (p->error == 0) {
        p->error = 0xd;
      }
      goto LAB_001042f3;
    }
    sVar8 = p->g->nsub;
    opnd = sVar8 + 1;
    p->g->nsub = opnd;
    if ((long)opnd < 10) {
      p->pbegin[sVar8 + 1] = lVar14;
    }
    doemit(p,0x34000000,opnd);
    pcVar16 = p->next;
    if ((pcVar16 < p->end) &&
       (((p->end <= pcVar16 + 1 || (*pcVar16 != '\\')) || (pcVar16[1] != ')')))) {
      p_bre(p,0x5c,0x29);
    }
    if (((long)opnd < 10) && (lVar7 = p->slen, p->pend[sVar8 + 1] = lVar7, lVar7 == 0)) {
      __assert_fail("p->pend[subno] != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                    ,0x1f8,"int p_simp_re()");
    }
    doemit(p,0x38000000,opnd);
    pcVar16 = p->next;
    if ((((p->end <= pcVar16) || (p->end <= pcVar16 + 1)) || (*pcVar16 != '\\')) ||
       (pcVar16[1] != ')')) {
      iVar11 = p->error;
      goto joined_r0x001041e0;
    }
    p->next = pcVar16 + 2;
  }
LAB_001042fa:
  pcVar16 = p->next;
  if (p->end <= pcVar16) goto LAB_0010446b;
  pcVar2 = pcVar16 + 1;
  if (*pcVar16 == '*') {
    p->next = pcVar2;
    doinsert(p,0x24000000,(p->slen - lVar14) + 1,lVar14);
    doemit(p,0x28000000,p->slen - lVar14);
    doinsert(p,0x2c000000,(p->slen - lVar14) + 1,lVar14);
    doemit(p,0x30000000,p->slen - lVar14);
  }
  else {
    if ((*pcVar16 != '\\' || p->end <= pcVar2) || (*pcVar2 != '{')) goto LAB_0010446b;
    p->next = pcVar16 + 2;
    iVar10 = p_count(p);
    pcVar16 = p->next;
    iVar11 = iVar10;
    if ((pcVar16 < p->end) && (*pcVar16 == ',')) {
      pcVar16 = pcVar16 + 1;
      p->next = pcVar16;
      iVar11 = 0x100;
      if ((pcVar16 < p->end) &&
         ((ppuVar12 = __ctype_b_loc(),
          (*(byte *)((long)*ppuVar12 + (long)*pcVar16 * 2 + 1) & 8) != 0 &&
          (iVar11 = p_count(p), iVar11 < iVar10)))) {
        if (p->error == 0) {
          p->error = 10;
        }
        p->next = nuls;
        p->end = nuls;
      }
    }
    repeat(p,lVar14,iVar10,iVar11);
    pcVar16 = p->next;
    pcVar2 = p->end;
    if ((((pcVar16 < pcVar2) && (pcVar16 + 1 < pcVar2)) && (*pcVar16 == '\\')) &&
       (pcVar16[1] == '}')) {
      p->next = pcVar16 + 2;
    }
    else {
      while (pcVar13 = pcVar16 + 1, pcVar16 < pcVar2) {
        if (((pcVar13 < pcVar2) && (*pcVar16 == '\\')) && (*pcVar13 == '}')) {
          iVar11 = p->error;
          iVar10 = 10;
          goto LAB_00104488;
        }
        p->next = pcVar13;
        pcVar16 = pcVar13;
      }
      iVar11 = p->error;
      iVar10 = 9;
LAB_00104488:
      if (iVar11 == 0) {
        p->error = iVar10;
      }
      p->next = nuls;
      p->end = nuls;
    }
  }
  goto LAB_00104479;
LAB_0010446b:
  bVar9 = true;
  bVar15 = false;
  if (uVar17 != 0x24) {
LAB_00104479:
    bVar9 = true;
    bVar15 = true;
  }
  goto LAB_00104030;
}

Assistant:

static void
p_bre(p, end1, end2)
struct parse *p;
int end1;		/* first terminating character */
int end2;		/* second terminating character */
{
	sopno start = HERE();
	int first = 1;			/* first subexpression? */
	int wasdollar = 0;

	if (EAT('^')) {
		EMIT(OBOL, 0);
		p->g->iflags |= USEBOL;
		p->g->nbol++;
	}
	while (MORE() && !SEETWO(end1, end2)) {
		wasdollar = p_simp_re(p, first);
		first = 0;
	}
	if (wasdollar) {	/* oops, that was a trailing anchor */
		DROP(1);
		EMIT(OEOL, 0);
		p->g->iflags |= USEEOL;
		p->g->neol++;
	}

	REQUIRE(HERE() != start, REG_EMPTY);	/* require nonempty */
}